

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  uint uVar1;
  int *piVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImU32 IVar5;
  ImGuiWindowSettings *pIVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  ImGuiWindowSettings *pIVar10;
  ImGuiContext *ctx;
  
  pIVar3 = GImGui;
  iVar4 = (GImGui->SettingsWindows).Size;
  if (iVar4 == (GImGui->SettingsWindows).Capacity) {
    if (iVar4 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar4 / 2 + iVar4;
    }
    iVar9 = iVar4 + 1;
    if (iVar4 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar2 = *piVar2 + 1;
    pIVar6 = (ImGuiWindowSettings *)
             (*GImAllocatorAllocFunc)((long)iVar9 * 0x18,GImAllocatorUserData);
    pIVar10 = (pIVar3->SettingsWindows).Data;
    if (pIVar10 != (ImGuiWindowSettings *)0x0) {
      memcpy(pIVar6,pIVar10,(long)(pIVar3->SettingsWindows).Size * 0x18);
      pIVar10 = (pIVar3->SettingsWindows).Data;
      if ((pIVar10 != (ImGuiWindowSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
    }
    (pIVar3->SettingsWindows).Data = pIVar6;
    (pIVar3->SettingsWindows).Capacity = iVar9;
    iVar4 = (pIVar3->SettingsWindows).Size;
  }
  else {
    pIVar6 = (GImGui->SettingsWindows).Data;
  }
  pIVar10 = pIVar6 + iVar4;
  pIVar10->Name = (char *)0x0;
  pIVar10->ID = 0;
  (pIVar10->Pos).x = 0;
  (pIVar10->Pos).y = 0;
  *(undefined8 *)((long)&pIVar6[iVar4].Pos.x + 1) = 0;
  iVar4 = (pIVar3->SettingsWindows).Size;
  uVar1 = iVar4 + 1;
  (pIVar3->SettingsWindows).Size = uVar1;
  if (-1 < iVar4) {
    pIVar6 = (pIVar3->SettingsWindows).Data;
    pIVar10 = pIVar6 + ((ulong)uVar1 - 1);
    pcVar7 = strstr(name,"###");
    if (pcVar7 != (char *)0x0) {
      name = pcVar7;
    }
    pcVar7 = ImStrdup(name);
    pIVar10->Name = pcVar7;
    IVar5 = ImHashStr(name,0,0);
    pIVar6[(ulong)uVar1 - 1].ID = IVar5;
    return pIVar10;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x4f0,"T &ImVector<ImGuiWindowSettings>::back() [T = ImGuiWindowSettings]");
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    settings->Name = ImStrdup(name);
    settings->ID = ImHashStr(name);
    return settings;
}